

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::WATParser::GlobalType> *
wasm::WATParser::globaltype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::GlobalType> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  _Uninitialized<wasm::Type,_true> _Var2;
  bool bVar3;
  undefined4 uVar4;
  string_view expected;
  undefined1 local_c0 [8];
  Result<wasm::Type> type;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  string local_78;
  undefined1 local_58 [8];
  Result<wasm::Type> _val;
  
  this = &ctx->in;
  expected._M_str = "mut";
  expected._M_len = 3;
  bVar3 = Lexer::takeSExprStart(this,expected);
  valtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)local_c0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_c0);
  if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
    type.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),local_58,
               (undefined1 *)
               ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.
                      id + (long)local_58));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = puVar1;
    if ((undefined8 *)
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == &local_88) {
      *puVar1 = local_88;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x18) =
           uStack_80;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> =
           type.val.super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x10) =
           local_88;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8) = local_90;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_58);
    uVar4 = 0;
    if (bVar3) {
      bVar3 = Lexer::takeRParen(this);
      uVar4 = 1;
      if (!bVar3) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"expected end of globaltype","");
        Lexer::err((Err *)local_58,this,&local_78);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x10
                 );
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = puVar1;
        _Var2._M_storage.id =
             (Type)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
        if ((Type)local_58 == _Var2._M_storage.id) {
          *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                    0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
        }
        ((_Uninitialized<wasm::Type,_true> *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8))->
        _M_storage = (Type)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                           _M_storage.id;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) =
             '\x01';
        local_58 = (undefined1  [8])_Var2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00bc7b95;
      }
    }
    *(undefined4 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = uVar4;
    ((_Uninitialized<wasm::Type,_true> *)
    ((long)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8))->_M_storage =
         (Type)local_c0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) = '\0';
  }
LAB_00bc7b95:
  std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::GlobalTypeT> globaltype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto type = valtype(ctx);
  CHECK_ERR(type);

  if (mutability == Mutable && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of globaltype");
  }

  return ctx.makeGlobalType(mutability, *type);
}